

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recompose.hpp
# Opt level: O2

void __thiscall
MGARD::Recomposer<float>::recompose
          (Recomposer<float> *this,float *data_,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *dims,size_t target_level,
          bool hierarchical,vector<unsigned_long,_std::allocator<unsigned_long>_> *strides)

{
  size_t *psVar1;
  size_t *psVar2;
  size_t sVar3;
  size_t sVar4;
  size_t stride;
  pointer puVar5;
  ostream *poVar6;
  pointer puVar7;
  pointer puVar8;
  ulong uVar9;
  int i;
  long lVar10;
  unsigned_long uVar11;
  uint uVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  bool bVar13;
  allocator_type local_49;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  this->data = data_;
  puVar5 = (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar10 = 1;
  puVar8 = (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar7 = puVar8; puVar7 != puVar5; puVar7 = puVar7 + 1) {
    lVar10 = lVar10 * *puVar7;
  }
  if ((strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
               (long)puVar5 - (long)puVar8 >> 3,&local_49);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(strides,&local_48);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
    puVar8 = (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar9 = (ulong)((long)puVar5 - (long)puVar8) >> 3 & 0xffffffff;
    uVar11 = 1;
    while( true ) {
      uVar9 = uVar9 - 1;
      if ((int)(uint)uVar9 < 0) break;
      uVar12 = (uint)uVar9 & 0x7fffffff;
      (strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar12] = uVar11;
      uVar11 = uVar11 * puVar8[uVar12];
    }
    for (uVar9 = 0; uVar9 < (ulong)((long)puVar5 - (long)puVar8 >> 3); uVar9 = uVar9 + 1) {
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar6," ");
      puVar8 = (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  this->data_buffer_size = lVar10 << 2;
  init(this,(EVP_PKEY_CTX *)dims);
  if ((this->level_dims).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->level_dims).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    init_levels((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&local_48,dims,target_level);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::_M_move_assign(&this->level_dims,&local_48);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)&local_48);
  }
  uVar9 = (ulong)(1 << ((char)target_level - 1U & 0x1f));
  lVar10 = (long)(dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  if (lVar10 == 1) {
    lVar10 = 0x18;
    while (bVar13 = target_level != 0, target_level = target_level - 1, bVar13) {
      sVar3 = **(size_t **)
                ((long)&(((this->level_dims).
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data + lVar10);
      if (hierarchical) {
        recompose_level_1D_hierarhical_basis(this,this->data,sVar3,(float)uVar9,true);
      }
      else {
        recompose_level_1D(this,this->data,sVar3,(float)uVar9,true);
      }
      lVar10 = lVar10 + 0x18;
      uVar9 = uVar9 >> 1;
    }
  }
  else if (lVar10 == 2) {
    lVar10 = 0x18;
    while (bVar13 = target_level != 0, target_level = target_level - 1, bVar13) {
      psVar1 = *(size_t **)
                ((long)&(((this->level_dims).
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data + lVar10);
      sVar3 = *psVar1;
      sVar4 = psVar1[1];
      stride = *(strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      if (hierarchical) {
        recompose_level_2D_hierarhical_basis(this,this->data,sVar3,sVar4,(float)uVar9,stride);
      }
      else {
        recompose_level_2D(this,this->data,sVar3,sVar4,(float)uVar9,stride);
      }
      lVar10 = lVar10 + 0x18;
      uVar9 = uVar9 >> 1;
    }
  }
  else if (lVar10 == 3) {
    lVar10 = 0x18;
    while (bVar13 = target_level != 0, target_level = target_level - 1, bVar13) {
      psVar1 = *(size_t **)
                ((long)&(((this->level_dims).
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data + lVar10);
      psVar2 = (strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar3 = *psVar2;
      sVar4 = psVar2[1];
      if (hierarchical) {
        recompose_level_3D_hierarchical_basis
                  (this,this->data,*psVar1,psVar1[1],psVar1[2],(float)uVar9,sVar3,sVar4);
      }
      else {
        recompose_level_3D(this,this->data,*psVar1,psVar1[1],psVar1[2],(float)uVar9,sVar3,sVar4);
      }
      lVar10 = lVar10 + 0x18;
      uVar9 = uVar9 >> 1;
    }
  }
  return;
}

Assistant:

void recompose(T * data_, const vector<size_t>& dims, size_t target_level, bool hierarchical=false, vector<size_t> strides=vector<size_t>()){
		data = data_;
		size_t num_elements = 1;
		for(const auto& d:dims){
			num_elements *= d;
		}
		if(strides.size() == 0){
			strides = vector<size_t>(dims.size());
			size_t stride = 1;
			for(int i=dims.size()-1; i>=0; i--){
				strides[i] = stride;
				stride *= dims[i];
			}
			for(int i=0; i<dims.size(); i++){
				cout << strides[i] << " ";
			}
			cout << endl;
		}
		data_buffer_size = num_elements * sizeof(T);
		init(dims);
        if(level_dims.empty()){
            level_dims = init_levels(dims, target_level);
        }
		size_t h = 1 << (target_level - 1);
		if(dims.size() == 1){
			for(int i=0; i<target_level; i++){
				hierarchical ? recompose_level_1D_hierarhical_basis(data, level_dims[i+1][0], h) : recompose_level_1D(data, level_dims[i+1][0], h);
				h >>= 1;
			}
		}
		else if(dims.size() == 2){
			for(int i=0; i<target_level; i++){
				size_t n1 = level_dims[i+1][0];
				size_t n2 = level_dims[i+1][1];
				hierarchical ? recompose_level_2D_hierarhical_basis(data, n1, n2, (T)h, strides[0]) : recompose_level_2D(data, n1, n2, (T)h, strides[0]);
				h >>= 1;
			}
		}
        else if(dims.size() == 3){
            for(int i=0; i<target_level; i++){
                size_t n1 = level_dims[i+1][0];
                size_t n2 = level_dims[i+1][1];
                size_t n3 = level_dims[i+1][2];
                hierarchical ? recompose_level_3D_hierarchical_basis(data, n1, n2, n3, (T)h, strides[0], strides[1]) : recompose_level_3D(data, n1, n2, n3, (T)h, strides[0], strides[1]);
                h >>= 1;
            }
        }
	}